

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeTraversalSymbols
          (MeshEdgebreakerTraversalDecoder *this)

{
  long lVar1;
  char *pcVar2;
  int64_t iVar3;
  int64_t iVar4;
  uint8_t *puVar5;
  size_t sVar6;
  undefined1 uVar7;
  uint16_t uVar8;
  bool bVar9;
  ulong in_RAX;
  uint64_t traversal_size;
  ulong local_18;
  
  uVar7 = (this->buffer_).field_0x31;
  uVar8 = (this->buffer_).bitstream_version_;
  (this->symbol_buffer_).bit_mode_ = (this->buffer_).bit_mode_;
  (this->symbol_buffer_).field_0x31 = uVar7;
  (this->symbol_buffer_).bitstream_version_ = uVar8;
  pcVar2 = (this->buffer_).data_;
  iVar3 = (this->buffer_).data_size_;
  iVar4 = (this->buffer_).pos_;
  puVar5 = (this->buffer_).bit_decoder_.bit_buffer_;
  sVar6 = (this->buffer_).bit_decoder_.bit_offset_;
  (this->symbol_buffer_).bit_decoder_.bit_buffer_end_ = (this->buffer_).bit_decoder_.bit_buffer_end_
  ;
  (this->symbol_buffer_).bit_decoder_.bit_offset_ = sVar6;
  (this->symbol_buffer_).pos_ = iVar4;
  (this->symbol_buffer_).bit_decoder_.bit_buffer_ = puVar5;
  (this->symbol_buffer_).data_ = pcVar2;
  (this->symbol_buffer_).data_size_ = iVar3;
  local_18 = in_RAX;
  bVar9 = DecoderBuffer::StartBitDecoding(&this->symbol_buffer_,true,&local_18);
  if (bVar9) {
    uVar7 = (this->symbol_buffer_).field_0x31;
    uVar8 = (this->symbol_buffer_).bitstream_version_;
    (this->buffer_).bit_mode_ = (this->symbol_buffer_).bit_mode_;
    (this->buffer_).field_0x31 = uVar7;
    (this->buffer_).bitstream_version_ = uVar8;
    pcVar2 = (this->symbol_buffer_).data_;
    iVar3 = (this->symbol_buffer_).data_size_;
    iVar4 = (this->symbol_buffer_).pos_;
    puVar5 = (this->symbol_buffer_).bit_decoder_.bit_buffer_;
    sVar6 = (this->symbol_buffer_).bit_decoder_.bit_offset_;
    (this->buffer_).bit_decoder_.bit_buffer_end_ =
         (this->symbol_buffer_).bit_decoder_.bit_buffer_end_;
    (this->buffer_).bit_decoder_.bit_offset_ = sVar6;
    (this->buffer_).pos_ = iVar4;
    (this->buffer_).bit_decoder_.bit_buffer_ = puVar5;
    (this->buffer_).data_ = pcVar2;
    (this->buffer_).data_size_ = iVar3;
    lVar1 = (this->buffer_).pos_;
    if (local_18 <= (ulong)((this->buffer_).data_size_ - lVar1)) {
      (this->buffer_).pos_ = lVar1 + local_18;
      return true;
    }
  }
  return false;
}

Assistant:

bool DecodeTraversalSymbols() {
    uint64_t traversal_size;
    symbol_buffer_ = buffer_;
    if (!symbol_buffer_.StartBitDecoding(true, &traversal_size)) {
      return false;
    }
    buffer_ = symbol_buffer_;
    if (traversal_size > static_cast<uint64_t>(buffer_.remaining_size())) {
      return false;
    }
    buffer_.Advance(traversal_size);
    return true;
  }